

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManSetPhasePattern(Gia_Man_t *p,Vec_Int_t *vCiValues)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCiValues_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManCiNum(p);
  iVar2 = Vec_IntSize(vCiValues);
  if (iVar1 == iVar2) {
    local_24 = 0;
    while( true ) {
      bVar4 = false;
      if (local_24 < p->nObjs) {
        pGStack_20 = Gia_ManObj(p,local_24);
        bVar4 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar1 = Gia_ObjIsCi(pGStack_20);
      if (iVar1 == 0) {
        Gia_ObjSetPhase(p,pGStack_20);
      }
      else {
        iVar1 = Gia_ObjCioId(pGStack_20);
        uVar3 = Vec_IntEntry(vCiValues,iVar1);
        *(ulong *)pGStack_20 = *(ulong *)pGStack_20 & 0x7fffffffffffffff | (ulong)uVar3 << 0x3f;
      }
      local_24 = local_24 + 1;
    }
    return;
  }
  __assert_fail("Gia_ManCiNum(p) == Vec_IntSize(vCiValues)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x186,"void Gia_ManSetPhasePattern(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManSetPhasePattern( Gia_Man_t * p, Vec_Int_t * vCiValues )  
{
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(p) == Vec_IntSize(vCiValues) );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) )
            pObj->fPhase = Vec_IntEntry( vCiValues, Gia_ObjCioId(pObj) );
        else
            Gia_ObjSetPhase( p, pObj );
}